

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::NegatePropagateStatistics::Operation<int>
               (LogicalType *type,BaseStatistics *istats,Value *new_min,Value *new_max)

{
  int iVar1;
  int input;
  Value local_70;
  
  iVar1 = NumericStats::GetMax<int>(istats);
  input = NumericStats::GetMin<int>(istats);
  iVar1 = NegateOperator::Operation<int,int>(iVar1);
  Value::Numeric(&local_70,type,(long)iVar1);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  iVar1 = NegateOperator::Operation<int,int>(input);
  Value::Numeric(&local_70,type,(long)iVar1);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
  return false;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &istats, Value &new_min, Value &new_max) {
		auto max_value = NumericStats::GetMax<T>(istats);
		auto min_value = NumericStats::GetMin<T>(istats);
		if (!NegateOperator::CanNegate<T>(min_value) || !NegateOperator::CanNegate<T>(max_value)) {
			return true;
		}
		// new min is -max
		new_min = Value::Numeric(type, NegateOperator::Operation<T, T>(max_value));
		// new max is -min
		new_max = Value::Numeric(type, NegateOperator::Operation<T, T>(min_value));
		return false;
	}